

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

AddressParts *
gen_lea_modrm_0(AddressParts *__return_storage_ptr__,CPUX86State *env,DisasContext *s,int modrm)

{
  MemOp MVar1;
  bool bVar2;
  byte bVar3;
  uint8_t uVar4;
  uint16_t uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  int code;
  _Bool havesib;
  target_long disp;
  int rm;
  int mod;
  int scale;
  int index;
  int base;
  int def_seg;
  int modrm_local;
  DisasContext *s_local;
  CPUX86State *env_local;
  
  index = 3;
  mod = -1;
  rm = 0;
  _code = 0;
  uVar6 = modrm >> 6 & 3;
  uVar7 = modrm & 7;
  scale = uVar7 | s->rex_b;
  if (uVar6 != 3) {
    MVar1 = s->aflag;
    if (MVar1 == MO_16) {
      if (uVar6 == 0) {
        if (uVar7 == 6) {
          scale = -1;
          uVar5 = x86_lduw_code(env,s);
          _code = (ulong)uVar5;
          goto LAB_00553a4f;
        }
      }
      else if (uVar6 == 1) {
        uVar4 = x86_ldub_code(env,s);
        _code = (ulong)(char)uVar4;
      }
      else {
        uVar5 = x86_lduw_code(env,s);
        _code = (ulong)(short)uVar5;
      }
      switch(uVar7) {
      case 0:
        scale = 3;
        mod = 6;
        break;
      case 1:
        scale = 3;
        mod = 7;
        break;
      case 2:
        scale = 5;
        mod = 6;
        index = 2;
        break;
      case 3:
        scale = 5;
        mod = 7;
        index = 2;
        break;
      case 4:
        scale = 6;
        break;
      case 5:
        scale = 7;
        break;
      case 6:
        scale = 5;
        index = 2;
        break;
      default:
        scale = 3;
      }
    }
    else {
      if (MVar1 != MO_32 && MVar1 != MO_64) {
        fprintf(_stderr,"%s:%d: tcg fatal error\n",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/translate.c"
                ,0x913);
        abort();
      }
      bVar2 = false;
      if (uVar7 == 4) {
        bVar3 = x86_ldub_code(env,s);
        uVar7 = (uint)bVar3;
        rm = (int)uVar7 >> 6;
        mod = (int)uVar7 >> 3 & 7U | s->rex_x;
        if (mod == 4) {
          mod = -1;
        }
        scale = uVar7 & 7 | s->rex_b;
        bVar2 = true;
      }
      if (uVar6 == 0) {
        if ((scale & 7U) == 5) {
          scale = -1;
          uVar8 = x86_ldl_code(env,s);
          _code = (ulong)(int)uVar8;
          if ((s->code64 != 0) && (!bVar2)) {
            scale = -2;
            _code = s->pc + (long)s->rip_offset + _code;
          }
        }
      }
      else if (uVar6 == 1) {
        uVar4 = x86_ldub_code(env,s);
        _code = (ulong)(char)uVar4;
      }
      else {
        uVar8 = x86_ldl_code(env,s);
        _code = (ulong)(int)uVar8;
      }
      if ((scale == 4) && (s->popl_esp_hack != 0)) {
        _code = (long)s->popl_esp_hack + _code;
      }
      if ((scale == 5) || (scale == 4)) {
        index = 2;
      }
    }
  }
LAB_00553a4f:
  __return_storage_ptr__->def_seg = index;
  __return_storage_ptr__->base = scale;
  __return_storage_ptr__->index = mod;
  __return_storage_ptr__->scale = rm;
  __return_storage_ptr__->disp = _code;
  return __return_storage_ptr__;
}

Assistant:

static AddressParts gen_lea_modrm_0(CPUX86State *env, DisasContext *s,
                                    int modrm)
{
    int def_seg, base, index, scale, mod, rm;
    target_long disp;
    bool havesib;

    def_seg = R_DS;
    index = -1;
    scale = 0;
    disp = 0;

    mod = (modrm >> 6) & 3;
    rm = modrm & 7;
    base = rm | REX_B(s);

    if (mod == 3) {
        /* Normally filtered out earlier, but including this path
           simplifies multi-byte nop, as well as bndcl, bndcu, bndcn.  */
        goto done;
    }

    switch (s->aflag) {
    case MO_64:
    case MO_32:
        havesib = 0;
        if (rm == 4) {
            int code = x86_ldub_code(env, s);
            scale = (code >> 6) & 3;
            index = ((code >> 3) & 7) | REX_X(s);
            if (index == 4) {
                index = -1;  /* no index */
            }
            base = (code & 7) | REX_B(s);
            havesib = 1;
        }

        switch (mod) {
        case 0:
            if ((base & 7) == 5) {
                base = -1;
                disp = (int32_t)x86_ldl_code(env, s);
                if (CODE64(s) && !havesib) {
                    base = -2;
                    disp += s->pc + s->rip_offset;
                }
            }
            break;
        case 1:
            disp = (int8_t)x86_ldub_code(env, s);
            break;
        default:
        case 2:
            disp = (int32_t)x86_ldl_code(env, s);
            break;
        }

        /* For correct popl handling with esp.  */
        if (base == R_ESP && s->popl_esp_hack) {
            disp += s->popl_esp_hack;
        }
        if (base == R_EBP || base == R_ESP) {
            def_seg = R_SS;
        }
        break;

    case MO_16:
        if (mod == 0) {
            if (rm == 6) {
                base = -1;
                disp = x86_lduw_code(env, s);
                break;
            }
        } else if (mod == 1) {
            disp = (int8_t)x86_ldub_code(env, s);
        } else {
            disp = (int16_t)x86_lduw_code(env, s);
        }

        switch (rm) {
        case 0:
            base = R_EBX;
            index = R_ESI;
            break;
        case 1:
            base = R_EBX;
            index = R_EDI;
            break;
        case 2:
            base = R_EBP;
            index = R_ESI;
            def_seg = R_SS;
            break;
        case 3:
            base = R_EBP;
            index = R_EDI;
            def_seg = R_SS;
            break;
        case 4:
            base = R_ESI;
            break;
        case 5:
            base = R_EDI;
            break;
        case 6:
            base = R_EBP;
            def_seg = R_SS;
            break;
        default:
        case 7:
            base = R_EBX;
            break;
        }
        break;

    default:
        tcg_abort();
    }

 done:
    return (AddressParts){ def_seg, base, index, scale, disp };
}